

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O1

void __thiscall Threadpool<Searchthread>::wait_finished(Threadpool<Searchthread> *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->m;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  while (((this->tasks).
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur !=
          (this->tasks).
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur ||
         ((this->busy).super___atomic_base<unsigned_int>._M_i != 0))) {
    std::condition_variable::wait((unique_lock *)&this->cv_finished);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void wait_finished() {
		std::unique_lock<std::mutex> lock(m);
		cv_finished.wait(lock, [this]() { return tasks.empty() && (busy == 0); });
	}